

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::solvePhase1(HEkkDual *this)

{
  double dVar1;
  int iVar2;
  HEkk *this_00;
  HighsOptions *pHVar3;
  bool bVar4;
  HighsDebugStatus HVar5;
  uint uVar6;
  HEkk *pHVar7;
  char *format;
  EVP_PKEY_CTX *ctx;
  HighsInt *pHVar8;
  allocator local_79;
  HighsInt *local_78;
  string local_70;
  string local_50;
  
  this_00 = this->ekk_instance_;
  (this_00->status_).has_dual_objective_value = false;
  (this_00->status_).has_primal_objective_value = false;
  this->rebuild_reason = 0;
  bVar4 = HEkk::bailout(this_00);
  if (bVar4) {
    return;
  }
  highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
              "dual-phase-1-start\n");
  HEkk::initialiseBound(this->ekk_instance_,kDual,this->solve_phase,false);
  HEkk::initialiseNonbasicValueAndMove(this->ekk_instance_);
  if ((this_00->info_).valid_backtracking_basis_ == false) {
    HEkk::putBacktrackingBasis(this->ekk_instance_);
  }
  local_78 = &this->solve_phase;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,7,0);
  do {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,8,0);
    rebuild(this);
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,8,0);
    if (this->solve_phase == -1) {
      HighsSimplexAnalysis::simplexTimerStop(this->analysis,7,0);
      return;
    }
    if (this->solve_phase == -3) {
      this_00->model_status_ = kSolveError;
      return;
    }
    bVar4 = HEkk::bailout(this->ekk_instance_);
    if (bVar4) goto LAB_00337544;
    do {
      std::__cxx11::string::string((string *)&local_50,"Before iteration",&local_79);
      HVar5 = debugDualSimplex(this,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      if (HVar5 == kLogicalError) {
        *local_78 = 0xfffffffd;
        return;
      }
      iVar2 = (this_00->info_).simplex_strategy;
      if (iVar2 == 2) {
        iterateTasks(this);
      }
      else if (iVar2 == 3) {
        iterateMulti(this);
      }
      else {
        iterate(this);
      }
      bVar4 = HEkk::bailout(this->ekk_instance_);
    } while ((!bVar4) && (this->rebuild_reason == 0));
    if (this->ekk_instance_->solve_bailout_ != false) goto LAB_00337544;
  } while (((this_00->status_).has_fresh_rebuild != true) ||
          (bVar4 = HEkk::rebuildRefactor(this->ekk_instance_,this->rebuild_reason), bVar4));
  bVar4 = HEkk::tabooBadBasisChange(this->ekk_instance_);
  if (bVar4) {
    *local_78 = 5;
    return;
  }
LAB_00337544:
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,7,0);
  pHVar8 = local_78;
  pHVar7 = this->ekk_instance_;
  if (pHVar7->solve_bailout_ != false) {
    return;
  }
  if (this->row_out == -1) {
    highsLogDev(&(pHVar7->options_->super_HighsOptionsStruct).log_options,kDetailed,
                "dual-phase-1-optimal\n");
    pHVar8 = local_78;
    dVar1 = (this_00->info_).dual_objective_value;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      assessPhase1Optimality(this);
      goto LAB_003376b9;
    }
LAB_0033763e:
    *pHVar8 = 2;
  }
  else {
    if ((this->rebuild_reason | 2U) == 0xb) {
      this->solve_phase = -3;
      format = 
      "Dual simplex detected excessive primal values: consider scaling down the LP bounds\n";
      if (this->rebuild_reason == 9) {
        format = 
        "Dual simplex ratio test failed due to excessive dual values: consider scaling down the LP objective coefficients\n"
        ;
      }
      highsLogUser(&(pHVar7->options_->super_HighsOptionsStruct).log_options,kError,format);
      pHVar7 = this->ekk_instance_;
    }
    else {
      if (this->variable_in != -1) goto LAB_003376b9;
      ctx = (EVP_PKEY_CTX *)0x1;
      highsLogDev(&(pHVar7->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "dual-phase-1-unbounded\n");
      pHVar7 = this->ekk_instance_;
      if ((pHVar7->info_).costs_perturbed == true) {
        cleanup(this,ctx);
        highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "Cleaning up cost perturbation when unbounded in phase 1\n");
        if (this->dualInfeasCount != 0) goto LAB_003376b9;
        goto LAB_0033763e;
      }
      *pHVar8 = 0xfffffffd;
    }
    highsLogDev(&(pHVar7->options_->super_HighsOptionsStruct).log_options,kInfo,
                "dual-phase-1-not-solved\n");
    this_00->model_status_ = kSolveError;
  }
LAB_003376b9:
  if (((this->ekk_instance_->info_).num_dual_infeasibilities < 1) ||
     (this_00->model_status_ != kMin)) {
    std::__cxx11::string::string((string *)&local_70,"End of solvePhase1",&local_79);
    HVar5 = debugDualSimplex(this,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    if (HVar5 == kLogicalError) {
      *pHVar8 = 0xfffffffd;
      return;
    }
  }
  uVar6 = *pHVar8 + 3;
  if ((uVar6 < 6) && ((0x33U >> (uVar6 & 0x1f) & 1) != 0)) {
    pHVar8 = &DAT_003af760 + uVar6;
  }
  else {
    pHVar7 = this->ekk_instance_;
    highsLogDev(&(pHVar7->options_->super_HighsOptionsStruct).log_options,kInfo,
                "HEkkDual::solvePhase1 solve_phase == %d (solve call %d; iter %d)\n",
                (ulong)(uint)*pHVar8,(ulong)(uint)pHVar7->debug_solve_call_num_,
                (ulong)(uint)pHVar7->iteration_count_);
  }
  if ((*pHVar8 + 3U < 6) && ((0x23U >> (*pHVar8 + 3U & 0x1f) & 1) != 0)) {
    HEkk::initialiseBound(this->ekk_instance_,kDual,2,false);
    HEkk::initialiseNonbasicValueAndMove(this->ekk_instance_);
    if (this->solve_phase == 2) {
      pHVar3 = this->ekk_instance_->options_;
      if (this->ekk_instance_->dual_simplex_phase1_cleanup_level_ <
          (pHVar3->super_HighsOptionsStruct).max_dual_simplex_phase1_cleanup_level) {
        (this_00->info_).allow_cost_shifting = true;
        (this_00->info_).allow_cost_perturbation = true;
      }
      else if (((this_00->info_).allow_cost_perturbation & 1U) == 0) {
        highsLogDev(&(pHVar3->super_HighsOptionsStruct).log_options,kWarning,
                    "Moving to phase 2, but not allowing cost perturbation\n");
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::solvePhase1() {
  // Performs dual phase 1 iterations. Returns solve_phase with value
  //
  // kSolvePhaseError => Solver error
  //
  // kSolvePhaseTabooBasis => Only basis change is taboo
  //
  // kSolvePhaseExit => LP identified as dual infeasible
  //
  // kSolvePhaseUnknown => Back-tracking due to singularity
  //
  // kSolvePhase1 => Dual infeasibility suspected, but have to go out
  // and back in to solvePhase1 to perform fresh rebuild. Also if
  // bailing out due to reaching time/iteration limit.
  //
  // kSolvePhase2 => Continue with dual phase 2 iterations

  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;
  // When starting a new phase the (updated) dual objective function
  // value isn't known. Indicate this so that when the value computed
  // from scratch in build() isn't checked against the updated
  // value
  status.has_primal_objective_value = false;
  status.has_dual_objective_value = false;
  // Set rebuild_reason so that it's assigned when first tested
  rebuild_reason = kRebuildReasonNo;
  // Use to set solve_phase = kSolvePhase1 and ekk_instance_.solve_bailout_ =
  // false so they are set if solvePhase1() is called directly - but it never is
  assert(solve_phase == kSolvePhase1);
  assert(!ekk_instance_.solve_bailout_);
  if (ekk_instance_.bailout()) return;
  // Report the phase start
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
              "dual-phase-1-start\n");
  // Switch to dual phase 1 bounds
  ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, solve_phase);
  ekk_instance_.initialiseNonbasicValueAndMove();

  // If there's no backtracking basis, save the initial basis in case of
  // backtracking
  if (!info.valid_backtracking_basis_) ekk_instance_.putBacktrackingBasis();

  // Main solving structure
  analysis->simplexTimerStart(IterateClock);
  for (;;) {
    analysis->simplexTimerStart(IterateDualRebuildClock);
    rebuild();
    analysis->simplexTimerStop(IterateDualRebuildClock);
    if (solve_phase == kSolvePhaseError) {
      model_status = HighsModelStatus::kSolveError;
      return;
    }
    if (solve_phase == kSolvePhaseUnknown) {
      // If backtracking, may change phase, so drop out
      analysis->simplexTimerStop(IterateClock);
      return;
    }
    if (ekk_instance_.bailout()) break;
    for (;;) {
      if (debugDualSimplex("Before iteration") ==
          HighsDebugStatus::kLogicalError) {
        solve_phase = kSolvePhaseError;
        return;
      }
      switch (info.simplex_strategy) {
        default:
        case kSimplexStrategyDualPlain:
          iterate();
          break;
        case kSimplexStrategyDualTasks:
          iterateTasks();
          break;
        case kSimplexStrategyDualMulti:
          iterateMulti();
          break;
      }
      if (ekk_instance_.bailout()) break;
      assert(solve_phase != kSolvePhaseTabooBasis);
      if (rebuild_reason) break;
    }
    if (ekk_instance_.solve_bailout_) break;
    // If the data are fresh from rebuild(), possibly break out of the
    // outer loop to see what's occurred
    //
    // Deciding whether to rebuild is now more complicated if
    // refactorization is being avoided, since
    // status.has_fresh_rebuild being true may not imply that there is
    // a fresh factorization
    //
    bool finished = status.has_fresh_rebuild &&
                    !ekk_instance_.rebuildRefactor(rebuild_reason);
    if (finished && ekk_instance_.tabooBadBasisChange()) {
      // A bad basis change has had to be made taboo without any other
      // basis changes having been performed from a fresh rebuild. In
      // other words, the only basis change that could be made is not
      // permitted, so no definitive statement about the LP can be
      // made.
      solve_phase = kSolvePhaseTabooBasis;
      return;
    }
    if (finished) break;
  }
  analysis->simplexTimerStop(IterateClock);
  // Possibly return due to bailing out, having now stopped
  // IterateClock
  if (ekk_instance_.solve_bailout_) return;

  // If bailing out, should have done so already
  assert(!ekk_instance_.solve_bailout_);
  // Assess outcome of dual phase 1
  if (row_out == kNoRowChosen) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "dual-phase-1-optimal\n");
    // Optimal in phase 1
    if (info.dual_objective_value == 0) {
      // Zero phase 1 objective so go to phase 2
      //
      // This is the usual way to exit phase 1. Although the test
      // looks ambitious, the dual objective is the sum of products of
      // primal and dual values for nonbasic variables. For dual
      // simplex phase 1, the primal bounds are set so that when the
      // dual value is feasible, the primal value is set to
      // zero. Otherwise the value is +1/-1 according to the required
      // sign of the dual, except for free variables, where the bounds
      // are [-1000, 1000].
      //
      // OK if costs are perturbed, since they remain perturbed in phase 2 until
      // the final clean-up
      solve_phase = kSolvePhase2;
    } else {
      // A nonzero dual objective value at an optimal solution of
      // phase 1 means that there may be dual infeasibilities. If the
      // objective value is very negative, then it's clear
      // enough. However, if it's small in magnitude, it could be the
      // sum of values, all of which are smaller than the dual
      // feasibility tolerance. Plus there may be cost perturbations
      // to remove before reliable conclusions on dual infeasibility
      // of the (scaled) LP being solved can be drawn.
      //
      // If assessPhase1Optimality() is happy that there are no dual
      // infeasibilities, it will set solve_phase = kSolvePhase2;
      assessPhase1Optimality();
    }
  } else if (rebuild_reason == kRebuildReasonChooseColumnFail ||
             rebuild_reason == kRebuildReasonExcessivePrimalValue) {
    // chooseColumn has failed or excessive primal values have been
    // created Behave as "Report strange issues" below
    solve_phase = kSolvePhaseError;
    // Solve error is opaque to users, so put in some logging
    if (rebuild_reason == kRebuildReasonChooseColumnFail) {
      highsLogUser(
          ekk_instance_.options_->log_options, HighsLogType::kError,
          "Dual simplex ratio test failed due to excessive dual values: "
          "consider scaling down the LP objective coefficients\n");
    } else {
      highsLogUser(ekk_instance_.options_->log_options, HighsLogType::kError,
                   "Dual simplex detected excessive primal values: consider "
                   "scaling down the LP bounds\n");
    }
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "dual-phase-1-not-solved\n");
    model_status = HighsModelStatus::kSolveError;
  } else if (variable_in == -1) {
    // We got dual phase 1 unbounded - strange
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "dual-phase-1-unbounded\n");
    // This use of costs_alt_perturbed is (unsurprisingly) not
    // executed by ctest
    //
    // assert(99==1);
    if (ekk_instance_.info_.costs_perturbed) {
      // Clean up perturbation
      cleanup();
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "Cleaning up cost perturbation when unbounded in phase 1\n");
      if (dualInfeasCount == 0) {
        // No dual infeasibilities and (since unbounded) at least zero
        // phase 1 objective so go to phase 2
        solve_phase = kSolvePhase2;
      }
    } else {
      // Report strange issues
      solve_phase = kSolvePhaseError;
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                  "dual-phase-1-not-solved\n");
      model_status = HighsModelStatus::kSolveError;
    }
  }

  // Debug here since not all simplex data will be correct until after
  // rebuild() when switching to Phase 2
  //
  // Also have to avoid debug when the model status is not set and
  // there are dual infeasibilities, since this happens legitimately
  // when the LP is dual infeasible. However, the model status can't
  // be set to dual infeasible until perturbations have been removed.
  //
  const bool no_debug = ekk_instance_.info_.num_dual_infeasibilities > 0 &&
                        model_status == HighsModelStatus::kNotset;
  if (!no_debug) {
    if (debugDualSimplex("End of solvePhase1") ==
        HighsDebugStatus::kLogicalError) {
      solve_phase = kSolvePhaseError;
      return;
    }
  }

  // Can also get here with solve_phase = kSolvePhaseError
  const bool solve_phase_ok =
      solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2 ||
      solve_phase == kSolvePhaseExit || solve_phase == kSolvePhaseError;
  if (!solve_phase_ok)
    highsLogDev(
        ekk_instance_.options_->log_options, HighsLogType::kInfo,
        "HEkkDual::solvePhase1 solve_phase == %d (solve call %d; iter %d)\n",
        (int)solve_phase, (int)ekk_instance_.debug_solve_call_num_,
        (int)ekk_instance_.iteration_count_);
  assert(solve_phase_ok);
  if (solve_phase == kSolvePhase2 || solve_phase == kSolvePhaseExit ||
      solve_phase == kSolvePhaseError) {
    // Moving to phase 2 or exiting, so make sure that the simplex
    // bounds and nonbasic value/move correspond to the LP
    ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, kSolvePhase2);
    ekk_instance_.initialiseNonbasicValueAndMove();
    if (solve_phase == kSolvePhase2) {
      // Moving to phase 2 so possibly reinstate cost perturbation
      if (ekk_instance_.dual_simplex_phase1_cleanup_level_ <
          ekk_instance_.options_->max_dual_simplex_phase1_cleanup_level) {
        // Allow cost perturbation for now, but may have to prevent it
        // to avoid cleanup-perturbation loops
        info.allow_cost_shifting = true;
        info.allow_cost_perturbation = true;
      }
      // Comment if cost perturbation is not permitted
      if (!info.allow_cost_perturbation)
        highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                    "Moving to phase 2, but not allowing cost perturbation\n");
    }
  }
  return;
}